

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_gramma.hpp
# Opt level: O2

void __thiscall SwitchChildStatement::LogOutput(SwitchChildStatement *this)

{
  string str;
  allocator local_29;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"This is a switch child statement",&local_29);
  LogTools::GrammaNormalLogs(g_log_tools,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void LogOutput() {
        string str("This is a switch child statement");
        g_log_tools->GrammaNormalLogs(str);
    }